

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp.cpp
# Opt level: O1

int __thiscall pg::PPSolver::getRegionStatus(PPSolver *this,int i,int p)

{
  int iVar1;
  Game *pGVar2;
  uint64_t *puVar3;
  int *piVar4;
  Error *this_00;
  int *piVar5;
  int *piVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  
  uVar10 = (ulong)(uint)i;
  if (-1 < i) {
    pGVar2 = (this->super_Solver).game;
    do {
      if (pGVar2->_priority[uVar10] != p) break;
      puVar3 = ((this->super_Solver).disabled)->_bits;
      if (((puVar3[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) == 0) && (this->region[uVar10] <= p)) {
        if ((((pGVar2->_owner)._bits[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) == 0) ==
            (bool)((byte)p & 1)) {
          iVar8 = pGVar2->_outedges[pGVar2->_firstouts[uVar10]];
          if (iVar8 != -1) {
            piVar5 = pGVar2->_outedges + (long)pGVar2->_firstouts[uVar10] + 1;
            do {
              uVar11 = (ulong)iVar8;
              cVar7 = '\a';
              if ((puVar3[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) == 0) {
                cVar7 = this->region[uVar11] < p;
              }
              if ((cVar7 != '\a') && (cVar7 != '\0')) {
                return -2;
              }
              iVar8 = *piVar5;
              piVar5 = piVar5 + 1;
            } while (iVar8 != -1);
          }
        }
        else if (this->strategy[uVar10] == -1) {
          return -2;
        }
      }
      iVar8 = (int)uVar10;
      uVar10 = (ulong)(iVar8 - 1);
    } while (0 < iVar8);
  }
  piVar5 = this->regions[p].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = this->regions[p].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar5 == piVar4) {
    iVar8 = -1;
  }
  else {
    pGVar2 = (this->super_Solver).game;
    iVar8 = -1;
    do {
      uVar10 = (ulong)*piVar5;
      if (((((pGVar2->_owner)._bits[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) == 0 ^ (byte)p) & 1) == 0)
      {
        iVar9 = pGVar2->_outedges[pGVar2->_firstouts[uVar10]];
        if (iVar9 != -1) {
          piVar6 = pGVar2->_outedges + (long)pGVar2->_firstouts[uVar10] + 1;
          do {
            uVar10 = (ulong)iVar9;
            iVar9 = iVar8;
            if (((((this->super_Solver).disabled)->_bits[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) == 0)
               && (((iVar1 = this->region[uVar10], iVar1 <= p ||
                    (iVar9 = iVar1, iVar8 != -1 && iVar8 <= iVar1)) && (iVar9 = iVar8, iVar1 < p))))
            {
              this_00 = (Error *)__cxa_allocate_exception(0x40);
              Error::Error(this_00,"logic error",
                           "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/pp.cpp"
                           ,0x108);
              __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
            }
            iVar8 = iVar9;
            iVar9 = *piVar6;
            piVar6 = piVar6 + 1;
          } while (iVar9 != -1);
        }
      }
      piVar5 = piVar5 + 1;
    } while (piVar5 != piVar4);
  }
  return iVar8;
}

Assistant:

int
PPSolver::getRegionStatus(int i, int p)
{
    const int pl = p&1;

    // check if the region is closed in the subgame
    for (int j=i; j>=0 && priority(j)==p; j--) {
        if (disabled[j] or region[j] > p) {
            // escape not in region
            continue;
        } else if (owner(j) == pl) {
            // region won by escape owner
            // it is therefore closed if it has a strategy
            if (strategy[j] == -1) return -2;
        } else {
            // region lost by escape owner
            // it is therefore closed if there are no edges to lower regions
            for (auto curedge = outs(j); *curedge != -1; curedge++) {
                int to =*curedge;
                if (disabled[to]) continue;
                if (region[to] < p) return -2; // open
            }
        }
    }
    // closed in the subgame, so find lowest higher region for possible promotion
    int lowest = -1;
    for (int j : regions[p]) {
        if (owner(j) != pl) {
            // losing node, find lowest higher ...
            for (auto curedge = outs(j); *curedge != -1; curedge++) {
                int to = *curedge;
                /** HOT SPOT of the iterator and minor hot spot of obtaining the region **/
                if (disabled[to]) continue;
                int r = region[to];
                if (r > p && (r < lowest || lowest == -1)) lowest = r;
                else if (r < p) LOGIC_ERROR;
            }
        }
    }
    return lowest; // -1 if dominion, <region> otherwise
}